

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  ParseInfoTree *pPVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_a8;
  string local_88;
  undefined4 local_68;
  undefined1 local_58 [8];
  string delimiter;
  ParseInfoTree *parent;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  ParserImpl *this_local;
  
  delimiter.field_2._8_8_ = this->parse_info_tree_;
  if ((ParseInfoTree *)delimiter.field_2._8_8_ != (ParseInfoTree *)0x0) {
    pPVar3 = CreateNested((ParseInfoTree *)delimiter.field_2._8_8_,field);
    this->parse_info_tree_ = pPVar3;
  }
  std::__cxx11::string::string((string *)local_58);
  bVar1 = ConsumeMessageDelimiter(this,(string *)local_58);
  if (bVar1) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      iVar2 = (*reflection->_vptr_Reflection[0x4b])(reflection,message,field,0);
      std::__cxx11::string::string((string *)&local_88,(string *)local_58);
      bVar1 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var,iVar2),&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_005a4e85;
      }
    }
    else {
      iVar2 = (*reflection->_vptr_Reflection[0x27])(reflection,message,field,0);
      std::__cxx11::string::string((string *)&local_a8,(string *)local_58);
      bVar1 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var_00,iVar2),&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_005a4e85;
      }
    }
    this->parse_info_tree_ = (ParseInfoTree *)delimiter.field_2._8_8_;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_005a4e85:
  local_68 = 1;
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool ConsumeFieldMessage(Message* message,
                           const Reflection* reflection,
                           const FieldDescriptor* field) {

    // If the parse information tree is not NULL, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != NULL) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field), delimiter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field),
                        delimiter));
    }

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }